

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_align<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
                 *handler)

{
  char cVar1;
  bool bVar2;
  alignment align;
  ulong uVar3;
  char *pcVar4;
  
  pcVar4 = begin + 1;
  uVar3 = (ulong)(pcVar4 != end);
  do {
    cVar1 = begin[uVar3];
    if (cVar1 == '<') {
      align = ALIGN_LEFT;
LAB_001ac513:
      if ((int)uVar3 != 0) {
        if (*begin == L'{') {
          specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        pcVar4 = begin + 2;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
          ).super_specs_setter<char>.specs_)->super_align_spec).fill_ = (int)*begin;
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
      ::on_align(handler,align);
      return pcVar4;
    }
    if (cVar1 == '^') {
      align = ALIGN_CENTER;
      goto LAB_001ac513;
    }
    if (cVar1 == '>') {
      align = ALIGN_RIGHT;
      goto LAB_001ac513;
    }
    if (cVar1 == '=') {
      align = ALIGN_NUMERIC;
      goto LAB_001ac513;
    }
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}